

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall Vector_AngleBetween_Test::TestBody(Vector_AngleBetween_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  longdouble in_ST0;
  float fVar20;
  double dVar21;
  float fVar34;
  undefined1 auVar22 [16];
  float fVar33;
  float fVar35;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  AssertionResult gtest_ar_7;
  Float precise;
  AssertionResult gtest_ar;
  Float naive;
  Float abet;
  AssertHelper local_118;
  Vector3<float> local_110;
  undefined1 local_100 [12];
  undefined4 uStack_f4;
  float local_ec;
  string local_e8;
  double local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [16];
  long local_a0;
  long local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
  local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_e8,"0","AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0))",
             (int *)local_100,(float *)&local_110);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4b,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  local_100._0_8_ = &DAT_3e7ad7f29abcaf48;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_e8,
             "std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi","1e-7",
             (float *)&local_110,(double *)local_100);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4d,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.super_Tuple3<pbrt::Vector3,_float>.x = -1.1920929e-07;
  local_100._0_8_ = &DAT_3e7ad7f29abcaf48;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_e8,
             "std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2","1e-7",
             (float *)&local_110,(double *)local_100);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
  local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_e8,"0","AngleBetween(x, x)",(int *)local_100,(float *)&local_110);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x52,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ & 0xffffffff00000000;
  local_100._0_8_ = &DAT_3e9421f5f40d8376;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&local_e8,"std::abs(AngleBetween(x, -x) - Pi)","3e-7",(float *)&local_110,
             (double *)local_100);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x53,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = -0x3f4e7330b1dad2e9;
  local_a0 = -0x344a09b9bfb5a9f4;
  lVar12 = -0x38fcced62d42ebe3;
  lVar8 = 0x30705b042917ec1a;
  lVar9 = 0x20fd5db43a776693;
  lVar14 = 1;
  uVar16 = 0;
  local_90 = &DAT_5851f42d4c957f2e;
  do {
    auVar45 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar51 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar75._8_4_ = 0x3f7fffff;
    auVar75._0_8_ = 0x3f7fffff3f7fffff;
    auVar75._12_4_ = 0x3f7fffff;
    auVar76._8_4_ = 0xbf800000;
    auVar76._0_8_ = 0xbf800000bf800000;
    auVar76._12_4_ = 0xbf800000;
    auVar77._8_4_ = 0x40000000;
    auVar77._0_8_ = 0x4000000040000000;
    auVar77._12_4_ = 0x40000000;
    uVar6 = (uVar16 >> 0x1b ^ uVar16) * -0x7e25210b43d22bb3;
    uVar6 = uVar6 >> 0x21 ^ uVar6;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar6 * -0x4b2c51c6d8d41ef + lVar12;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar6 * 0xb046976f22528f5 + local_a0;
    auVar22 = vpunpcklqdq_avx(auVar17,auVar22);
    auVar19 = vpsrlvq_avx2(auVar22,auVar45);
    auVar18 = vpsrlvq_avx2(auVar22,auVar51);
    auVar22 = vpsrlq_avx(auVar22,0x3b);
    auVar22 = vpshufd_avx(auVar22,0xe8);
    auVar19 = vpshufd_avx(auVar19 ^ auVar18,0xe8);
    auVar17 = vprorvd_avx512vl(auVar19,auVar22);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar6 * 0x685f98a2018fade9 + local_98;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar6 * 0x696d29da565ad7fd + lVar8;
    auVar22 = vpunpcklqdq_avx(auVar56,auVar44);
    auVar19 = vpsrlvq_avx2(auVar22,auVar51);
    auVar18 = vpsrlvq_avx2(auVar22,auVar45);
    auVar22 = vpsrlq_avx(auVar22,0x3b);
    auVar22 = vpshufd_avx(auVar22,0xe8);
    auVar17 = vcvtudq2ps_avx512vl(auVar17);
    auVar19 = vpshufd_avx(auVar18 ^ auVar19,0xe8);
    auVar18 = vprorvd_avx512vl(auVar19,auVar22);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_90 + uVar6 * 0x5851f42d4c957f2d;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar6 * -0xf72fd4feea08587 + lVar9;
    auVar22 = vpunpcklqdq_avx(auVar67,auVar63);
    auVar51 = vpsrlvq_avx2(auVar22,auVar51);
    auVar19 = vpsrlvq_avx2(auVar22,auVar45);
    auVar45 = vpsrlq_avx(auVar22,0x3b);
    auVar45 = vpshufd_avx(auVar45,0xe8);
    auVar22 = vcvtudq2ps_avx512vl(auVar18);
    auVar51 = vpshufd_avx(auVar19 ^ auVar51,0xe8);
    auVar18._0_4_ = auVar17._0_4_ * 2.3283064e-10;
    auVar18._4_4_ = auVar17._4_4_ * 2.3283064e-10;
    auVar18._8_4_ = auVar17._8_4_ * 2.3283064e-10;
    auVar18._12_4_ = auVar17._12_4_ * 2.3283064e-10;
    auVar45 = vprorvd_avx512vl(auVar51,auVar45);
    auVar37._0_4_ = auVar22._0_4_ * 2.3283064e-10;
    auVar37._4_4_ = auVar22._4_4_ * 2.3283064e-10;
    auVar37._8_4_ = auVar22._8_4_ * 2.3283064e-10;
    auVar37._12_4_ = auVar22._12_4_ * 2.3283064e-10;
    auVar19 = vcvtudq2ps_avx512vl(auVar45);
    auVar45 = vminps_avx(auVar18,auVar75);
    auVar51 = vminps_avx(auVar37,auVar75);
    auVar22 = vfmadd213ps_fma(auVar45,auVar77,auVar76);
    auVar46._0_4_ = auVar19._0_4_ * 2.3283064e-10;
    auVar46._4_4_ = auVar19._4_4_ * 2.3283064e-10;
    auVar46._8_4_ = auVar19._8_4_ * 2.3283064e-10;
    auVar46._12_4_ = auVar19._12_4_ * 2.3283064e-10;
    auVar19 = vfmadd213ps_fma(auVar51,auVar77,auVar76);
    auVar45 = vminps_avx(auVar46,auVar75);
    auVar18 = vfmadd213ps_fma(auVar45,auVar77,auVar76);
    auVar45 = vinsertps_avx(auVar18,auVar22,0x4c);
    auVar51 = vinsertps_avx(auVar18,auVar22,0x1c);
    auVar57._0_4_ =
         auVar45._0_4_ * auVar45._0_4_ + auVar19._0_4_ * auVar19._0_4_ +
         auVar51._0_4_ * auVar51._0_4_;
    auVar57._4_4_ =
         auVar45._4_4_ * auVar45._4_4_ + auVar19._4_4_ * auVar19._4_4_ +
         auVar51._4_4_ * auVar51._4_4_;
    auVar57._8_4_ =
         auVar45._8_4_ * auVar45._8_4_ + auVar19._8_4_ * auVar19._8_4_ +
         auVar51._8_4_ * auVar51._8_4_;
    auVar57._12_4_ =
         auVar45._12_4_ * auVar45._12_4_ + auVar19._12_4_ * auVar19._12_4_ +
         auVar51._12_4_ * auVar51._12_4_;
    auVar51 = vsqrtps_avx(auVar57);
    local_88 = vdivps_avx(auVar18,auVar51);
    auVar45 = vshufps_avx(auVar51,auVar51,0xe1);
    local_78 = vdivps_avx(auVar19,auVar51);
    local_68 = vdivps_avx(auVar22,auVar45);
    local_b8 = vmovshdup_avx(local_88);
    local_58 = vmovshdup_avx(local_78);
    local_48 = vmovshdup_avx(local_68);
    local_100._8_4_ = local_68._0_4_;
    auVar45 = vinsertps_avx(local_78,local_88,0x4c);
    local_100._0_8_ = vmovlps_avx(auVar45);
    auVar45 = vunpcklps_avx(local_48,local_78);
    local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar45);
    dVar21 = (double)local_b8._0_4_;
    local_110.super_Tuple3<pbrt::Vector3,_float>.z = local_88._0_4_;
    dVar36 = (double)local_58._0_4_;
    dVar55 = (double)local_48._0_4_;
    dVar62 = (double)local_78._0_4_;
    dVar43 = (double)(float)local_100._8_4_;
    dVar66 = (double)local_110.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar43 * dVar43 + dVar21 * dVar21 + dVar36 * dVar36;
    auVar45 = vsqrtsd_avx(auVar70,auVar70);
    dVar69 = auVar45._0_8_;
    auVar51._0_8_ = dVar21 / dVar69;
    auVar51._8_8_ = local_b8._8_8_;
    auVar47._0_8_ = dVar43 / dVar69;
    auVar47._8_8_ = local_68._8_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar66 * dVar66 + dVar55 * dVar55 + dVar62 * dVar62;
    auVar45 = vsqrtsd_avx(auVar71,auVar71);
    dVar21 = auVar45._0_8_;
    auVar58._0_8_ = dVar55 / dVar21;
    auVar58._8_8_ = local_48._8_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (dVar36 / dVar69) * (dVar62 / dVar21);
    auVar45 = vfmadd231sd_fma(auVar45,auVar51,auVar58);
    auVar19._0_8_ = dVar66 / dVar21;
    auVar19._8_8_ = local_88._8_8_;
    auVar45 = vfmadd213sd_fma(auVar19,auVar47,auVar45);
    local_c8 = acos(auVar45._0_8_);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)((float)local_58._0_4_ * (float)local_78._0_4_)),
                              local_48,ZEXT416((uint)local_b8._0_4_));
    auVar45 = vfmadd231ss_fma(auVar45,local_68,local_88);
    if (0.0 <= auVar45._0_4_) {
      auVar45 = vblendps_avx(local_88,local_68,2);
      auVar51 = vblendps_avx(local_68,local_88,2);
      auVar45 = vsubps_avx(auVar45,auVar51);
      auVar38._0_4_ = auVar45._0_4_ * auVar45._0_4_;
      auVar38._4_4_ = auVar45._4_4_ * auVar45._4_4_;
      auVar38._8_4_ = auVar45._8_4_ * auVar45._8_4_;
      auVar38._12_4_ = auVar45._12_4_ * auVar45._12_4_;
      auVar45 = vmovshdup_avx(auVar38);
      auVar45 = ZEXT416((uint)(auVar38._0_4_ +
                              auVar45._0_4_ +
                              ((float)local_78._0_4_ - (float)local_58._0_4_) *
                              ((float)local_78._0_4_ - (float)local_58._0_4_)));
      auVar45 = vsqrtss_avx(auVar45,auVar45);
      auVar51 = ZEXT416((uint)(auVar45._0_4_ * 0.5));
      auVar45 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
      uVar1 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar1 & 1);
      fVar20 = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar45._0_4_));
      fVar20 = fVar20 + fVar20;
    }
    else {
      fVar20 = local_88._0_4_ + local_68._0_4_;
      fVar33 = local_88._4_4_ + local_68._4_4_;
      fVar34 = local_88._8_4_ + local_68._8_4_;
      fVar35 = local_88._12_4_ + local_68._12_4_;
      auVar23._0_4_ = fVar20 * fVar20;
      auVar23._4_4_ = fVar33 * fVar33;
      auVar23._8_4_ = fVar34 * fVar34;
      auVar23._12_4_ = fVar35 * fVar35;
      auVar45 = vmovshdup_avx(auVar23);
      auVar45 = ZEXT416((uint)(auVar23._0_4_ +
                              auVar45._0_4_ +
                              ((float)local_58._0_4_ + (float)local_78._0_4_) *
                              ((float)local_58._0_4_ + (float)local_78._0_4_)));
      auVar45 = vsqrtss_avx(auVar45,auVar45);
      auVar51 = ZEXT416((uint)(auVar45._0_4_ * 0.5));
      auVar45 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
      uVar1 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar1 & 1);
      auVar31._0_4_ = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar45._0_4_));
      auVar31._4_60_ = extraout_var;
      auVar45 = vfmadd132ss_fma(auVar31._0_16_,SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(0xc0000000));
      fVar20 = auVar45._0_4_;
    }
    local_ec = (float)local_c8;
    local_b8._0_4_ = fVar20;
    local_118.data_ = (AssertHelperData *)&DAT_3ed4f8b588e368f1;
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx512vl(ZEXT416((uint)(local_ec - fVar20)),auVar2);
    local_c8 = (double)CONCAT44(local_c8._4_4_,local_ec);
    local_ec = auVar45._0_4_ / local_ec;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_e8,"err","5e-6",&local_ec,(double *)&local_118);
    if ((char)local_e8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_118);
      std::ostream::_M_insert<double>((double)local_c8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,"vs ",3);
      std::ostream::_M_insert<double>((double)(float)local_b8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", a: ",5);
      pbrt::operator<<((ostream *)&(local_118.data_)->line,(Vector3<float> *)local_100);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", b: ",5);
      pbrt::operator<<((ostream *)&(local_118.data_)->line,&local_110);
      pcVar10 = "";
      if ((undefined8 *)local_e8._M_string_length != (undefined8 *)0x0) {
        pcVar10 = *(char **)local_e8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x67,pcVar10);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (((local_118.data_ != (AssertHelperData *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_118.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar14 = lVar14 + 2;
    lVar12 = lVar12 + -0x71f99dac5a85d7c6;
    lVar9 = lVar9 + 0x41fabb6874eecd26;
    uVar16 = uVar16 + 0x7fb5d329728ea185;
    local_a0 = local_a0 + -0x689413737f6b53e8;
    local_98 = local_98 + -0x7e9ce66163b5a5d2;
    lVar8 = lVar8 + 0x60e0b608522fd834;
    local_90 = local_90 + -0x4f5c17a566d501a4;
  } while (lVar14 != 0x30d41);
  lVar12 = -0x4691e8297086c7e9;
  lVar14 = 0x31b2e823d5b6720c;
  lVar11 = -0x16846185fa2cd2e3;
  lVar13 = 0x60650bbda8927e1a;
  lVar8 = 0x4e2fb43c6ca23d93;
  lVar9 = 0x1312d01;
  lVar15 = -0x55c9d73fe6416ad2;
  uVar16 = 0xc53fe288c0ecb080;
  do {
    auVar51 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar22 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar78._8_4_ = 0x3f7fffff;
    auVar78._0_8_ = 0x3f7fffff3f7fffff;
    auVar78._12_4_ = 0x3f7fffff;
    auVar80._8_4_ = 0x40000000;
    auVar80._0_8_ = 0x4000000040000000;
    auVar80._12_4_ = 0x40000000;
    uVar7 = (uVar16 >> 0x1b ^ uVar16) * -0x7e25210b43d22bb3;
    uVar7 = uVar7 >> 0x21 ^ uVar7;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar7 * 0x685f98a2018fade9 + lVar12;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar7 * 0x696d29da565ad7fd + lVar13;
    auVar45 = vpunpcklqdq_avx(auVar39,auVar24);
    auVar19 = vpsrlvq_avx2(auVar45,auVar51);
    auVar18 = vpsrlvq_avx2(auVar45,auVar22);
    auVar45 = vpsrlq_avx(auVar45,0x3b);
    auVar45 = vpshufd_avx(auVar45,0xe8);
    auVar19 = vpshufd_avx(auVar18 ^ auVar19,0xe8);
    auVar45 = vprorvd_avx512vl(auVar19,auVar45);
    auVar45 = vcvtudq2ps_avx512vl(auVar45);
    auVar25._0_4_ = auVar45._0_4_ * 2.3283064e-10;
    auVar25._4_4_ = auVar45._4_4_ * 2.3283064e-10;
    auVar25._8_4_ = auVar45._8_4_ * 2.3283064e-10;
    auVar25._12_4_ = auVar45._12_4_ * 2.3283064e-10;
    uVar6 = vcmpps_avx512vl(auVar25,auVar78,1);
    auVar45 = vmovshdup_avx(auVar25);
    bVar4 = (byte)(uVar6 >> 1);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar7 * 0x5851f42d4c957f2d + lVar15;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar7 * 0xb046976f22528f5 + lVar14;
    auVar19 = vpunpcklqdq_avx(auVar59,auVar48);
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)((byte)uVar6 & 1) * (int)auVar25._0_4_ +
                                      (uint)!(bool)((byte)uVar6 & 1) * 0x3f7fffff),
                              SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
    auVar18 = vpsrlvq_avx2(auVar19,auVar51);
    auVar17 = vpsrlvq_avx2(auVar19,auVar22);
    auVar19 = vpsrlq_avx(auVar19,0x3b);
    auVar44 = vfmadd213ss_fma(ZEXT416((uint)(bVar4 & 1) * auVar45._0_4_ +
                                      (uint)!(bool)(bVar4 & 1) * 0x3f7fffff),
                              SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
    auVar79._8_4_ = 0xbf800000;
    auVar79._0_8_ = 0xbf800000bf800000;
    auVar79._12_4_ = 0xbf800000;
    auVar45 = vpshufd_avx(auVar19,0xe8);
    auVar19 = vpshufd_avx(auVar17 ^ auVar18,0xe8);
    auVar45 = vprorvd_avx512vl(auVar19,auVar45);
    fVar33 = auVar37._0_4_;
    fVar20 = auVar44._0_4_;
    auVar45 = vcvtudq2ps_avx512vl(auVar45);
    auVar40._0_4_ = auVar45._0_4_ * 2.3283064e-10;
    auVar40._4_4_ = auVar45._4_4_ * 2.3283064e-10;
    auVar40._8_4_ = auVar45._8_4_ * 2.3283064e-10;
    auVar40._12_4_ = auVar45._12_4_ * 2.3283064e-10;
    auVar45 = vminps_avx(auVar40,auVar78);
    auVar19 = vfmadd213ps_fma(auVar45,auVar80,auVar79);
    auVar49._0_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar49._4_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar49._8_4_ = auVar19._8_4_ * auVar19._8_4_;
    auVar49._12_4_ = auVar19._12_4_ * auVar19._12_4_;
    auVar45 = vmovshdup_avx(auVar49);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + fVar20 * fVar20 + auVar49._0_4_));
    auVar45 = vsqrtss_avx(auVar45,auVar45);
    auVar50._0_4_ = auVar45._0_4_;
    auVar60._0_4_ = fVar20 / auVar50._0_4_;
    auVar60._4_12_ = auVar44._4_12_;
    auVar50._4_4_ = auVar50._0_4_;
    auVar50._8_4_ = auVar50._0_4_;
    auVar50._12_4_ = auVar50._0_4_;
    auVar45 = vdivps_avx(auVar19,auVar50);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar7 * -0x4b2c51c6d8d41ef + lVar11;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar7 * -0xf72fd4feea08587 + lVar8;
    auVar19 = vpunpcklqdq_avx(auVar68,auVar64);
    auVar18 = vpsrlvq_avx2(auVar19,auVar51);
    auVar22 = vpsrlvq_avx2(auVar19,auVar22);
    auVar51 = vpsrlq_avx(auVar19,0x3b);
    auVar51 = vpshufd_avx(auVar51,0xe8);
    auVar22 = vpshufd_avx(auVar22 ^ auVar18,0xe8);
    auVar51 = vprorvd_avx512vl(auVar22,auVar51);
    auVar51 = vcvtudq2ps_avx512vl(auVar51);
    auVar52._0_4_ = auVar51._0_4_ * 2.3283064e-10;
    auVar52._4_4_ = auVar51._4_4_ * 2.3283064e-10;
    auVar52._8_4_ = auVar51._8_4_ * 2.3283064e-10;
    auVar52._12_4_ = auVar51._12_4_ * 2.3283064e-10;
    auVar51 = vminps_avx(auVar52,auVar78);
    auVar22 = vfmadd213ps_fma(auVar51,auVar80,auVar79);
    auVar65._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar65._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar65._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar65._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar51 = vmovshdup_avx(auVar65);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + fVar33 * fVar33 + auVar65._0_4_));
    auVar51 = vsqrtss_avx(auVar51,auVar51);
    auVar26._0_4_ = auVar51._0_4_;
    local_78._0_4_ = fVar33 / auVar26._0_4_;
    local_78._4_12_ = auVar37._4_12_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    local_88 = vdivps_avx(auVar22,auVar26);
    local_48 = vmovshdup_avx(local_88);
    auVar51 = vinsertps_avx(local_48,local_78,0x10);
    local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar51);
    auVar27._8_4_ = 0x7fffffff;
    auVar27._0_8_ = 0x7fffffff7fffffff;
    auVar27._12_4_ = 0x7fffffff;
    local_110.super_Tuple3<pbrt::Vector3,_float>.z = local_88._0_4_;
    auVar74._0_8_ = local_88._0_8_ ^ 0x8000000080000000;
    auVar74._8_4_ = local_88._8_4_ ^ 0x80000000;
    auVar74._12_4_ = local_88._12_4_ ^ 0x80000000;
    auVar53._0_8_ = CONCAT44(auVar37._4_4_,local_78._0_4_) ^ 0x8000000080000000;
    auVar53._8_4_ = auVar37._8_4_ ^ 0x80000000;
    auVar53._12_4_ = auVar37._12_4_ ^ 0x80000000;
    local_68 = vpternlogd_avx512vl(auVar74,auVar45,auVar27,0xd8);
    local_58 = vpternlogd_avx512vl(auVar53,auVar60,auVar27,0xd8);
    local_b8 = vpshufd_avx(local_68,0xf5);
    dVar21 = (double)local_b8._0_4_;
    local_100._4_4_ = local_58._0_4_;
    local_100._0_4_ = local_b8._0_4_;
    local_100._8_4_ = local_68._0_4_;
    dVar36 = (double)local_58._0_4_;
    dVar43 = (double)(float)local_100._8_4_;
    dVar55 = (double)local_48._0_4_;
    dVar62 = (double)(float)local_78._0_4_;
    dVar66 = (double)local_110.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar43 * dVar43 + dVar21 * dVar21 + dVar36 * dVar36;
    auVar45 = vsqrtsd_avx(auVar72,auVar72);
    dVar69 = auVar45._0_8_;
    auVar28._0_8_ = dVar21 / dVar69;
    auVar28._8_8_ = local_b8._8_8_;
    auVar54._0_8_ = dVar43 / dVar69;
    auVar54._8_8_ = local_68._8_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar66 * dVar66 + dVar55 * dVar55 + dVar62 * dVar62;
    auVar45 = vsqrtsd_avx(auVar73,auVar73);
    dVar21 = auVar45._0_8_;
    auVar61._0_8_ = dVar55 / dVar21;
    auVar61._8_8_ = local_48._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = (dVar62 / dVar21) * (dVar36 / dVar69);
    auVar45 = vfmadd231sd_fma(auVar41,auVar28,auVar61);
    auVar29._0_8_ = dVar66 / dVar21;
    auVar29._8_8_ = local_88._8_8_;
    auVar45 = vfmadd213sd_fma(auVar29,auVar54,auVar45);
    local_a0 = lVar11;
    local_98 = lVar14;
    local_90 = (undefined1 *)lVar12;
    local_c8 = acos(auVar45._0_8_);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._0_4_ * (float)local_58._0_4_)),
                              local_48,ZEXT416((uint)local_b8._0_4_));
    auVar45 = vfmadd231ss_fma(auVar45,local_68,local_88);
    if (0.0 <= auVar45._0_4_) {
      auVar45 = vsubps_avx(local_88,local_68);
      auVar42._0_4_ = auVar45._0_4_ * auVar45._0_4_;
      auVar42._4_4_ = auVar45._4_4_ * auVar45._4_4_;
      auVar42._8_4_ = auVar45._8_4_ * auVar45._8_4_;
      auVar42._12_4_ = auVar45._12_4_ * auVar45._12_4_;
      auVar45 = vmovshdup_avx(auVar42);
      auVar45 = ZEXT416((uint)(auVar42._0_4_ +
                              auVar45._0_4_ +
                              ((float)local_78._0_4_ - (float)local_58._0_4_) *
                              ((float)local_78._0_4_ - (float)local_58._0_4_)));
      auVar45 = vsqrtss_avx(auVar45,auVar45);
      auVar51 = ZEXT416((uint)(auVar45._0_4_ * 0.5));
      auVar45 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
      uVar1 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar1 & 1);
      fVar20 = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar45._0_4_));
      fVar20 = fVar20 + fVar20;
    }
    else {
      fVar20 = local_88._0_4_ + local_68._0_4_;
      fVar33 = local_88._4_4_ + local_68._4_4_;
      fVar34 = local_88._8_4_ + local_68._8_4_;
      fVar35 = local_88._12_4_ + local_68._12_4_;
      auVar30._0_4_ = fVar20 * fVar20;
      auVar30._4_4_ = fVar33 * fVar33;
      auVar30._8_4_ = fVar34 * fVar34;
      auVar30._12_4_ = fVar35 * fVar35;
      auVar45 = vmovshdup_avx(auVar30);
      auVar45 = ZEXT416((uint)(auVar30._0_4_ +
                              auVar45._0_4_ +
                              ((float)local_78._0_4_ + (float)local_58._0_4_) *
                              ((float)local_78._0_4_ + (float)local_58._0_4_)));
      auVar45 = vsqrtss_avx(auVar45,auVar45);
      auVar51 = ZEXT416((uint)(auVar45._0_4_ * 0.5));
      auVar45 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
      uVar1 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar1 & 1);
      auVar32._0_4_ = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar45._0_4_));
      auVar32._4_60_ = extraout_var_00;
      auVar45 = vfmadd132ss_fma(auVar32._0_16_,SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(0xc0000000));
      fVar20 = auVar45._0_4_;
    }
    local_ec = (float)local_c8;
    local_b8._0_4_ = fVar20;
    local_118.data_ = (AssertHelperData *)&DAT_3ed4f8b588e368f1;
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx512vl(ZEXT416((uint)(local_ec - fVar20)),auVar3);
    local_c8 = (double)CONCAT44(local_c8._4_4_,local_ec);
    local_ec = auVar45._0_4_ / local_ec;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_e8,"err","5e-6",&local_ec,(double *)&local_118);
    if ((char)local_e8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_118);
      std::ostream::_M_insert<double>((double)local_c8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,"vs ",3);
      std::ostream::_M_insert<double>((double)(float)local_b8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", a: ",5);
      pbrt::operator<<((ostream *)&(local_118.data_)->line,(Vector3<float> *)local_100);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", b: ",5);
      pbrt::operator<<((ostream *)&(local_118.data_)->line,&local_110);
      pcVar10 = "";
      if ((undefined8 *)local_e8._M_string_length != (undefined8 *)0x0) {
        pcVar10 = *(char **)local_e8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x82,pcVar10);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (((local_118.data_ != (AssertHelperData *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_118.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar9 = lVar9 + 2;
    lVar14 = local_98 + -0x689413737f6b53e8;
    lVar11 = local_a0 + -0x71f99dac5a85d7c6;
    lVar12 = (long)local_90 + -0x7e9ce66163b5a5d2;
    lVar13 = lVar13 + 0x60e0b608522fd834;
    lVar8 = lVar8 + 0x41fabb6874eecd26;
    lVar15 = lVar15 + -0x4f5c17a566d501a4;
    uVar16 = uVar16 + 0x7fb5d329728ea185;
  } while (lVar9 != 0x1343a41);
  local_c0.data_._0_4_ = 0x40490fdb;
  acosl();
  local_ec = (float)in_ST0;
  local_34 = 3.1415455;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_100,"abet","precise",&local_34,&local_ec);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pbrt::detail::stringPrintfRecursive<float&>(&local_e8,"vs naive %f",(float *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 0x10),
               local_e8._M_dataplus._M_p,local_e8._M_string_length);
    if ((undefined8 *)CONCAT44(uStack_f4,local_100._8_4_) == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)CONCAT44(uStack_f4,local_100._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x91,pcVar10);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if ((((AssertHelperData *)local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ !=
          (AssertHelperData *)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((AssertHelperData *)local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ !=
        (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_100 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(Vector, AngleBetween) {
    EXPECT_EQ(0, AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0)));

    EXPECT_LT(std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi, 1e-7);
    EXPECT_LT(std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2,
              1e-7);

    Vector3f x = Normalize(Vector3f(1, -3, 10));
    EXPECT_EQ(0, AngleBetween(x, x));
    EXPECT_LT(std::abs(AngleBetween(x, -x) - Pi), 3e-7);

    Float maxErr = 0, sumErr = 0;
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;
    maxErr = 0;
    sumErr = 0;

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i + 10000000);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        // Make them face in opposite-ish directions
        a.x = std::copysign(a.x, -b.x);
        a.y = std::copysign(a.y, -b.y);
        a.z = std::copysign(a.z, -b.z);

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;

    Vector3f a(1, 1, 1), b(-1, -1.0001, -1);
    a = Normalize(a);
    b = Normalize(b);
    Vector3<long double> ad(1, 1, 1), bd(-1, -1.0001, -1);
    ad = Normalize(ad);
    bd = Normalize(bd);

    Float naive = SafeACos(Dot(a, b));
    Float precise = std::acos(Clamp(Dot(ad, bd), -1, 1));
    Float abet = AngleBetween(a, b);
    Float old = Pi - 2 * SafeASin(Length(a + b) / 2);
    EXPECT_EQ(abet, precise) << StringPrintf("vs naive %f", naive);
    // CO    LOG(WARNING) << StringPrintf("naive %f (err %f), abet %f (err %f)
    // old %f (err %f)", CO                                 naive,
    // std::abs(naive
    // - precise) / precise, CO                                 abet,
    // std::abs(abet - precise) / precise, CO old, std::abs(old - precise) /
    // precise);
}